

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

int MBAnalyzeBestIntra16Mode(VP8EncIterator *it)

{
  int iVar1;
  long in_RDI;
  int alpha;
  VP8Histogram histo;
  int best_mode;
  int best_alpha;
  int mode;
  int max_mode;
  VP8Histogram local_20;
  int local_18;
  int mode_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  undefined4 uVar3;
  
  uVar3 = 2;
  mode_00 = -1;
  local_18 = 0;
  VP8MakeLuma16Preds((VP8EncIterator *)CONCAT44(2,in_stack_fffffffffffffff0));
  for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
    InitHistogram(&local_20);
    (*VP8CollectHistogram)
              (*(uint8_t **)(in_RDI + 8),
               (uint8_t *)(*(long *)(in_RDI + 0x20) + (long)(int)(uint)VP8I16ModeOffsets[iVar2]),0,
               0x10,&local_20);
    iVar1 = GetAlpha(&local_20);
    if (mode_00 < iVar1) {
      local_18 = iVar2;
      mode_00 = iVar1;
    }
  }
  VP8SetIntra16Mode((VP8EncIterator *)CONCAT44(uVar3,iVar2),mode_00);
  return mode_00;
}

Assistant:

static int MBAnalyzeBestIntra16Mode(VP8EncIterator* const it) {
  const int max_mode = MAX_INTRA16_MODE;
  int mode;
  int best_alpha = DEFAULT_ALPHA;
  int best_mode = 0;

  VP8MakeLuma16Preds(it);
  for (mode = 0; mode < max_mode; ++mode) {
    VP8Histogram histo;
    int alpha;

    InitHistogram(&histo);
    VP8CollectHistogram(it->yuv_in_ + Y_OFF_ENC,
                        it->yuv_p_ + VP8I16ModeOffsets[mode],
                        0, 16, &histo);
    alpha = GetAlpha(&histo);
    if (IS_BETTER_ALPHA(alpha, best_alpha)) {
      best_alpha = alpha;
      best_mode = mode;
    }
  }
  VP8SetIntra16Mode(it, best_mode);
  return best_alpha;
}